

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O3

void __thiscall Assimp::AssbinChunkWriter::Grow(AssbinChunkWriter *this,size_t need)

{
  uint8_t *__src;
  ulong __n;
  uint8_t *__dest;
  ulong uVar1;
  
  __src = this->buffer;
  __n = this->cur_size;
  uVar1 = (__n >> 1) + __n;
  if (uVar1 <= need) {
    uVar1 = need;
  }
  if (uVar1 < this->initial) {
    uVar1 = this->initial;
  }
  __dest = (uint8_t *)operator_new__(uVar1);
  this->buffer = __dest;
  if (__src != (uint8_t *)0x0) {
    memcpy(__dest,__src,__n);
    operator_delete__(__src);
  }
  this->cur_size = uVar1;
  return;
}

Assistant:

void Grow(size_t need = 0)
    {
        size_t new_size = std::max(initial, std::max( need, cur_size+(cur_size>>1) ));

        const uint8_t* const old = buffer;
        buffer = new uint8_t[new_size];

        if (old) {
            memcpy(buffer,old,cur_size);
            delete[] old;
        }

        cur_size = new_size;
    }